

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

void __thiscall
notch::io::PlainTextNetworkReader::read_weights
          (PlainTextNetworkReader *this,istream *in,Array *w,Array *bias)

{
  ulong uVar1;
  ulong uVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = w->_M_size;
  uVar2 = bias->_M_size;
  lVar5 = 0;
  do {
    piVar3 = std::ws<char,std::char_traits<char>>(in);
    std::istream::_M_extract<float>((float *)piVar3);
    if (uVar2 <= uVar1) {
      uVar4 = 0;
      do {
        piVar3 = std::ws<char,std::char_traits<char>>(in);
        std::istream::_M_extract<float>((float *)piVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 < uVar1 / uVar2);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != uVar2 + (uVar2 == 0));
  return;
}

Assistant:

void read_weights(std::istream &in, Array &w, Array &bias) {
        size_t nInputs = w.size() / bias.size();
        size_t nOutputs = bias.size();
        for (size_t row = 0; row < nOutputs; ++row) {
            in >> std::ws >> bias[row];
            for (size_t col = 0; col < nInputs; ++col) {
                in >> std::ws >> w[row*nInputs + col];
            }
        }
    }